

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

void __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::draw
          (SparseTextureClampLookupResidencyTestCase *this,GLint target,GLint layer,
          ShaderProgram *program)

{
  deUint32 program_00;
  RenderContext *context;
  VertexArrayBinding *local_570;
  PrimitiveList local_520;
  undefined1 local_502;
  allocator<char> local_501;
  string local_500;
  void **local_4e0;
  undefined1 local_4d8 [8];
  VertexArrayBinding vertexArrays [2];
  string local_430;
  VertexArrayBinding local_410;
  allocator<char> local_3b9;
  string local_3b8;
  VertexArrayBinding local_398;
  allocator<char> local_341;
  string local_340;
  VertexArrayBinding local_320;
  allocator<char> local_2b9;
  string local_2b8;
  VertexArrayBinding local_298;
  undefined1 local_248 [8];
  VertexArrayBinding floatCoord;
  GLuint indices [6];
  float local_1d8 [2];
  GLfloat vertices [12];
  GLfloat texCoordCubeMap [6] [12];
  GLfloat texCoord3D [12];
  GLfloat texCoord2D [8];
  GLfloat texCoord1D [4];
  ShaderProgram *program_local;
  GLint layer_local;
  GLint target_local;
  SparseTextureClampLookupResidencyTestCase *this_local;
  
  texCoord2D[6] = 0.0;
  texCoord2D[7] = 1.0;
  texCoord3D[10] = 0.0;
  texCoord3D[0xb] = 0.0;
  texCoord2D[0] = 1.0;
  texCoord2D[1] = 0.0;
  texCoord2D[2] = 0.0;
  texCoord2D[3] = 1.0;
  texCoord2D[4] = 1.0;
  texCoord2D[5] = 1.0;
  memcpy(texCoordCubeMap[5] + 10,&DAT_02a6e240,0x30);
  memcpy(vertices + 10,&DAT_02a6e270,0x120);
  memcpy(local_1d8,&DAT_02a6e390,0x30);
  floatCoord.pointer.data = (void *)0x100000000;
  glu::VertexArrayBinding::VertexArrayBinding((VertexArrayBinding *)local_248);
  if ((target == 0xde0) || (target == 0x8c18)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"inCoord",&local_2b9);
    glu::va::Float(&local_298,&local_2b8,1,4,0,texCoord2D + 6);
    glu::VertexArrayBinding::operator=((VertexArrayBinding *)local_248,&local_298);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  else if (target == 0x806f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"inCoord",&local_341);
    glu::va::Float(&local_320,&local_340,3,4,0,texCoordCubeMap[5] + 10);
    glu::VertexArrayBinding::operator=((VertexArrayBinding *)local_248,&local_320);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator(&local_341);
  }
  else if (target == 0x8513) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"inCoord",&local_3b9);
    glu::va::Float(&local_398,&local_3b8,3,4,0,texCoordCubeMap[(long)layer + -1] + 10);
    glu::VertexArrayBinding::operator=((VertexArrayBinding *)local_248,&local_398);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"inCoord",
               (allocator<char> *)((long)&vertexArrays[1].pointer.data + 7));
    glu::va::Float(&local_410,&local_430,2,4,0,texCoord3D + 10);
    glu::VertexArrayBinding::operator=((VertexArrayBinding *)local_248,&local_410);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)((long)&vertexArrays[1].pointer.data + 7));
  }
  local_502 = 1;
  local_4e0 = (void **)local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"vertex",&local_501);
  glu::va::Float((VertexArrayBinding *)local_4d8,&local_500,3,4,0,local_1d8);
  local_4e0 = &vertexArrays[0].pointer.data;
  glu::VertexArrayBinding::VertexArrayBinding
            ((VertexArrayBinding *)local_4e0,(VertexArrayBinding *)local_248);
  local_502 = 0;
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  context = deqp::Context::getRenderContext
                      ((this->super_SparseTexture2LookupTestCase).
                       super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
                       super_TestCase.m_context);
  program_00 = glu::ShaderProgram::getProgram(program);
  glu::pr::TriangleStrip(&local_520,6,(deUint32 *)&floatCoord.pointer.data);
  glu::draw(context,program_00,2,(VertexArrayBinding *)local_4d8,&local_520,(DrawUtilCallback *)0x0)
  ;
  local_570 = (VertexArrayBinding *)&vertexArrays[1].pointer.data;
  do {
    local_570 = local_570 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_570);
  } while (local_570 != (VertexArrayBinding *)local_4d8);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_248);
  return;
}

Assistant:

void SparseTextureClampLookupResidencyTestCase::draw(GLint target, GLint layer, const ShaderProgram& program)
{
	const GLfloat texCoord1D[] = { 0.0f, 1.0f, 0.0f, 1.0f };

	const GLfloat texCoord2D[] = {
		0.0f, 0.0f, 1.0f, 0.0f, 0.0f, 1.0f, 1.0f, 1.0f,
	};

	const GLfloat texCoord3D[] = { 0.0f, 0.0f, 0.5f, 1.0f, 0.0f, 0.5f, 0.0f, 1.0f, 0.5f, 1.0f, 1.0f, 0.5f };

	const GLfloat texCoordCubeMap[6][12] = {
		{ 0.0f, 0.0f, 0.00f, 1.0f, 0.0f, 0.0f, 0.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f },
		{ 0.0f, 0.0f, 0.17f, 1.0f, 0.0f, 0.17f, 0.0f, 1.0f, 0.17f, 1.0f, 1.0f, 0.17f },
		{ 0.0f, 0.0f, 0.33f, 1.0f, 0.0f, 0.33f, 0.0f, 1.0f, 0.33f, 1.0f, 1.0f, 0.33f },
		{ 0.0f, 0.0f, 0.5f, 1.0f, 0.0f, 0.5f, 0.0f, 1.0f, 0.5f, 1.0f, 1.0f, 0.5f },
		{ 0.0f, 0.0f, 0.67f, 1.0f, 0.0f, 0.67f, 0.0f, 1.0f, 0.67f, 1.0f, 1.0f, 0.67f },
		{ 0.0f, 0.0f, 0.83f, 1.0f, 0.0f, 0.83f, 0.0f, 1.0f, 0.83f, 1.0f, 1.0f, 0.83f }
	};

	const GLfloat vertices[] = {
		-1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 0.0f, -1.0f, 1.0f, 0.0f, 1.0f, 1.0f, 0.0f,
	};

	const GLuint indices[] = { 0, 1, 2, 1, 2, 3 };

	VertexArrayBinding floatCoord;

	if (target == GL_TEXTURE_1D || target == GL_TEXTURE_1D_ARRAY)
		floatCoord = glu::va::Float("inCoord", 1, 4, 0, texCoord1D);
	else if (target == GL_TEXTURE_3D)
		floatCoord = glu::va::Float("inCoord", 3, 4, 0, texCoord3D);
	else if (target == GL_TEXTURE_CUBE_MAP)
		floatCoord = glu::va::Float("inCoord", 3, 4, 0, texCoordCubeMap[layer]);
	else
		floatCoord = glu::va::Float("inCoord", 2, 4, 0, texCoord2D);

	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("vertex", 3, 4, 0, vertices), floatCoord };

	glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indices), indices));
}